

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mrg5s.hpp
# Opt level: O1

void __thiscall trng::mrg5s::jump2(mrg5s *this,uint s)

{
  long lVar1;
  long lVar2;
  int32_t *piVar3;
  long lVar4;
  long lVar5;
  int k;
  long lVar6;
  uint uVar7;
  result_type d [5];
  result_type c [25];
  undefined8 local_148;
  undefined8 uStack_140;
  int local_138;
  undefined8 local_128;
  undefined8 uStack_120;
  int local_118;
  int32_t local_108 [2];
  int32_t aiStack_100 [2];
  int local_f8;
  int32_t local_f4;
  int32_t local_f0 [22];
  int32_t local_98 [28];
  
  local_108 = (int32_t  [2])*(undefined8 *)(this->P).a;
  aiStack_100 = (int32_t  [2])*(undefined8 *)((this->P).a + 2);
  local_f8 = (this->P).a[4];
  local_f4 = 1;
  local_f0[0] = 0;
  local_f0[1] = 0;
  local_f0[2] = 0;
  local_f0[3] = 0;
  local_f0[4] = 0;
  local_f0[5] = 1;
  local_f0[6] = 0;
  local_f0[7] = 0;
  local_f0[8] = 0;
  local_f0[9] = 0;
  local_f0[10] = 0;
  local_f0[0xb] = 1;
  local_f0[0xc] = 0;
  local_f0[0xd] = 0;
  local_f0[0xe] = 0;
  local_f0[0xf] = 0;
  local_f0[0x10] = 0;
  local_f0[0x11] = 1;
  local_f0[0x12] = 0;
  if (s != 0) {
    uVar7 = 0;
    do {
      int_math::matrix_mult<5>
                ((int32_t (*) [25])local_108,(int32_t (*) [25])local_108,(int32_t (*) [25])local_98,
                 0x7fffa78f);
      if (s <= uVar7 + 1) break;
      int_math::matrix_mult<5>
                ((int32_t (*) [25])local_98,(int32_t (*) [25])local_98,(int32_t (*) [25])local_108,
                 0x7fffa78f);
      uVar7 = uVar7 + 2;
    } while (uVar7 < s);
  }
  local_128 = *(undefined8 *)(this->S).r;
  uStack_120 = *(undefined8 *)((this->S).r + 2);
  local_118 = (this->S).r[4];
  if ((s & 1) == 0) {
    piVar3 = local_108;
    lVar4 = 0;
    do {
      lVar6 = 0;
      lVar5 = 0;
      do {
        lVar2 = ((long)*(int *)((long)&local_128 + lVar6 * 4) * (long)piVar3[lVar6]) % 0x7fffa78f;
        lVar1 = lVar2 + lVar5;
        lVar5 = lVar5 + -0x7fffa78f + lVar2;
        if (lVar1 < 0x7fffa78f) {
          lVar5 = lVar1;
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 != 5);
      *(int *)((long)&local_148 + lVar4 * 4) = (int)lVar5;
      lVar4 = lVar4 + 1;
      piVar3 = piVar3 + 5;
    } while (lVar4 != 5);
  }
  else {
    piVar3 = local_98;
    lVar4 = 0;
    do {
      lVar6 = 0;
      lVar5 = 0;
      do {
        lVar2 = ((long)*(int *)((long)&local_128 + lVar6 * 4) * (long)piVar3[lVar6]) % 0x7fffa78f;
        lVar1 = lVar2 + lVar5;
        lVar5 = lVar5 + -0x7fffa78f + lVar2;
        if (lVar1 < 0x7fffa78f) {
          lVar5 = lVar1;
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 != 5);
      *(int *)((long)&local_148 + lVar4 * 4) = (int)lVar5;
      lVar4 = lVar4 + 1;
      piVar3 = piVar3 + 5;
    } while (lVar4 != 5);
  }
  *(undefined8 *)(this->S).r = local_148;
  *(undefined8 *)((this->S).r + 2) = uStack_140;
  (this->S).r[4] = local_138;
  return;
}

Assistant:

TRNG_CUDA_ENABLE
  inline void mrg5s::jump2(unsigned int s) {
    result_type b[25], c[25];
    b[0] = P.a[0];
    b[1] = P.a[1];
    b[2] = P.a[2];
    b[3] = P.a[3];
    b[4] = P.a[4];
    b[5] = 1;
    b[6] = 0;
    b[7] = 0;
    b[8] = 0;
    b[9] = 0;
    b[10] = 0;
    b[11] = 1;
    b[12] = 0;
    b[13] = 0;
    b[14] = 0;
    b[15] = 0;
    b[16] = 0;
    b[17] = 1;
    b[18] = 0;
    b[19] = 0;
    b[20] = 0;
    b[21] = 0;
    b[22] = 0;
    b[23] = 1;
    b[24] = 0;
    for (unsigned int i{0}; i < s; ++i) {
      int_math::matrix_mult<5>(b, b, c, modulus);
      ++i;
      if (not(i < s))
        break;
      int_math::matrix_mult<5>(c, c, b, modulus);
    }
    const result_type r[5]{S.r[0], S.r[1], S.r[2], S.r[3], S.r[4]};
    result_type d[5];
    if ((s & 1u) == 0)
      int_math::matrix_vec_mult<5>(b, r, d, modulus);
    else
      int_math::matrix_vec_mult<5>(c, r, d, modulus);
    S.r[0] = d[0];
    S.r[1] = d[1];
    S.r[2] = d[2];
    S.r[3] = d[3];
    S.r[4] = d[4];
  }